

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_aes_setkey_enc(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  int iVar1;
  uint32_t *local_30;
  uint32_t *RK;
  uint i;
  uint keybits_local;
  uchar *key_local;
  mbedtls_aes_context *ctx_local;
  
  if (keybits == 0x80) {
    ctx->nr = 10;
  }
  else if (keybits == 0xc0) {
    ctx->nr = 0xc;
  }
  else {
    if (keybits != 0x100) {
      return -0x20;
    }
    ctx->nr = 0xe;
  }
  if (aes_init_done == 0) {
    aes_gen_tables();
    aes_init_done = 1;
  }
  local_30 = ctx->buf;
  ctx->rk = local_30;
  iVar1 = mbedtls_aesni_has_support(0x2000000);
  if (iVar1 == 0) {
    for (RK._0_4_ = 0; (uint)RK < keybits >> 5; RK._0_4_ = (uint)RK + 1) {
      local_30[(uint)RK] =
           CONCAT13(key[(uint)RK * 4 + 3],
                    CONCAT12(key[(uint)RK * 4 + 2],
                             CONCAT11(key[(uint)RK * 4 + 1],key[(uint)RK << 2])));
    }
    iVar1 = ctx->nr;
    if (iVar1 == 10) {
      for (RK._0_4_ = 0; (uint)RK < 10; RK._0_4_ = (uint)RK + 1) {
        local_30[4] = *local_30 ^ RCON[(uint)RK] ^ (uint)FSb[local_30[3] >> 8 & 0xff] ^
                      (uint)FSb[local_30[3] >> 0x10 & 0xff] << 8 ^
                      (uint)FSb[local_30[3] >> 0x18] << 0x10 ^ (uint)FSb[local_30[3] & 0xff] << 0x18
        ;
        local_30[5] = local_30[1] ^ local_30[4];
        local_30[6] = local_30[2] ^ local_30[5];
        local_30[7] = local_30[3] ^ local_30[6];
        local_30 = local_30 + 4;
      }
    }
    else if (iVar1 == 0xc) {
      for (RK._0_4_ = 0; (uint)RK < 8; RK._0_4_ = (uint)RK + 1) {
        local_30[6] = *local_30 ^ RCON[(uint)RK] ^ (uint)FSb[local_30[5] >> 8 & 0xff] ^
                      (uint)FSb[local_30[5] >> 0x10 & 0xff] << 8 ^
                      (uint)FSb[local_30[5] >> 0x18] << 0x10 ^ (uint)FSb[local_30[5] & 0xff] << 0x18
        ;
        local_30[7] = local_30[1] ^ local_30[6];
        local_30[8] = local_30[2] ^ local_30[7];
        local_30[9] = local_30[3] ^ local_30[8];
        local_30[10] = local_30[4] ^ local_30[9];
        local_30[0xb] = local_30[5] ^ local_30[10];
        local_30 = local_30 + 6;
      }
    }
    else if (iVar1 == 0xe) {
      for (RK._0_4_ = 0; (uint)RK < 7; RK._0_4_ = (uint)RK + 1) {
        local_30[8] = *local_30 ^ RCON[(uint)RK] ^ (uint)FSb[local_30[7] >> 8 & 0xff] ^
                      (uint)FSb[local_30[7] >> 0x10 & 0xff] << 8 ^
                      (uint)FSb[local_30[7] >> 0x18] << 0x10 ^ (uint)FSb[local_30[7] & 0xff] << 0x18
        ;
        local_30[9] = local_30[1] ^ local_30[8];
        local_30[10] = local_30[2] ^ local_30[9];
        local_30[0xb] = local_30[3] ^ local_30[10];
        local_30[0xc] =
             local_30[4] ^ (uint)FSb[local_30[0xb] & 0xff] ^
             (uint)FSb[local_30[0xb] >> 8 & 0xff] << 8 ^
             (uint)FSb[local_30[0xb] >> 0x10 & 0xff] << 0x10 ^
             (uint)FSb[local_30[0xb] >> 0x18] << 0x18;
        local_30[0xd] = local_30[5] ^ local_30[0xc];
        local_30[0xe] = local_30[6] ^ local_30[0xd];
        local_30[0xf] = local_30[7] ^ local_30[0xe];
        local_30 = local_30 + 8;
      }
    }
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = mbedtls_aesni_setkey_enc((uchar *)ctx->rk,key,(ulong)keybits);
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_aes_setkey_enc( mbedtls_aes_context *ctx, const unsigned char *key,
                    unsigned int keybits )
{
    unsigned int i;
    uint32_t *RK;

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( key != NULL );

    switch( keybits )
    {
        case 128: ctx->nr = 10; break;
        case 192: ctx->nr = 12; break;
        case 256: ctx->nr = 14; break;
        default : return( MBEDTLS_ERR_AES_INVALID_KEY_LENGTH );
    }

#if !defined(MBEDTLS_AES_ROM_TABLES)
    if( aes_init_done == 0 )
    {
        aes_gen_tables();
        aes_init_done = 1;
    }
#endif

#if defined(MBEDTLS_PADLOCK_C) && defined(MBEDTLS_PADLOCK_ALIGN16)
    if( aes_padlock_ace == -1 )
        aes_padlock_ace = mbedtls_padlock_has_support( MBEDTLS_PADLOCK_ACE );

    if( aes_padlock_ace )
        ctx->rk = RK = MBEDTLS_PADLOCK_ALIGN16( ctx->buf );
    else
#endif
    ctx->rk = RK = ctx->buf;

#if defined(MBEDTLS_AESNI_C) && defined(MBEDTLS_HAVE_X86_64)
    if( mbedtls_aesni_has_support( MBEDTLS_AESNI_AES ) )
        return( mbedtls_aesni_setkey_enc( (unsigned char *) ctx->rk, key, keybits ) );
#endif

    for( i = 0; i < ( keybits >> 5 ); i++ )
    {
        GET_UINT32_LE( RK[i], key, i << 2 );
    }

    switch( ctx->nr )
    {
        case 10:

            for( i = 0; i < 10; i++, RK += 4 )
            {
                RK[4]  = RK[0] ^ RCON[i] ^
                ( (uint32_t) FSb[ ( RK[3] >>  8 ) & 0xFF ]       ) ^
                ( (uint32_t) FSb[ ( RK[3] >> 16 ) & 0xFF ] <<  8 ) ^
                ( (uint32_t) FSb[ ( RK[3] >> 24 ) & 0xFF ] << 16 ) ^
                ( (uint32_t) FSb[ ( RK[3]       ) & 0xFF ] << 24 );

                RK[5]  = RK[1] ^ RK[4];
                RK[6]  = RK[2] ^ RK[5];
                RK[7]  = RK[3] ^ RK[6];
            }
            break;

        case 12:

            for( i = 0; i < 8; i++, RK += 6 )
            {
                RK[6]  = RK[0] ^ RCON[i] ^
                ( (uint32_t) FSb[ ( RK[5] >>  8 ) & 0xFF ]       ) ^
                ( (uint32_t) FSb[ ( RK[5] >> 16 ) & 0xFF ] <<  8 ) ^
                ( (uint32_t) FSb[ ( RK[5] >> 24 ) & 0xFF ] << 16 ) ^
                ( (uint32_t) FSb[ ( RK[5]       ) & 0xFF ] << 24 );

                RK[7]  = RK[1] ^ RK[6];
                RK[8]  = RK[2] ^ RK[7];
                RK[9]  = RK[3] ^ RK[8];
                RK[10] = RK[4] ^ RK[9];
                RK[11] = RK[5] ^ RK[10];
            }
            break;

        case 14:

            for( i = 0; i < 7; i++, RK += 8 )
            {
                RK[8]  = RK[0] ^ RCON[i] ^
                ( (uint32_t) FSb[ ( RK[7] >>  8 ) & 0xFF ]       ) ^
                ( (uint32_t) FSb[ ( RK[7] >> 16 ) & 0xFF ] <<  8 ) ^
                ( (uint32_t) FSb[ ( RK[7] >> 24 ) & 0xFF ] << 16 ) ^
                ( (uint32_t) FSb[ ( RK[7]       ) & 0xFF ] << 24 );

                RK[9]  = RK[1] ^ RK[8];
                RK[10] = RK[2] ^ RK[9];
                RK[11] = RK[3] ^ RK[10];

                RK[12] = RK[4] ^
                ( (uint32_t) FSb[ ( RK[11]       ) & 0xFF ]       ) ^
                ( (uint32_t) FSb[ ( RK[11] >>  8 ) & 0xFF ] <<  8 ) ^
                ( (uint32_t) FSb[ ( RK[11] >> 16 ) & 0xFF ] << 16 ) ^
                ( (uint32_t) FSb[ ( RK[11] >> 24 ) & 0xFF ] << 24 );

                RK[13] = RK[5] ^ RK[12];
                RK[14] = RK[6] ^ RK[13];
                RK[15] = RK[7] ^ RK[14];
            }
            break;
    }

    return( 0 );
}